

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PageAllocator.h
# Opt level: O1

void __thiscall
Memory::
PageAllocatorBase<Memory::PreReservedVirtualAllocWrapper,_Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
::LogFreeDecommittedSegment
          (PageAllocatorBase<Memory::PreReservedVirtualAllocWrapper,_Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
           *this,SegmentBase<Memory::PreReservedVirtualAllocWrapper> *segment)

{
  size_t sVar1;
  PageMemoryData *pPVar2;
  
  sVar1 = segment->segmentPageCount;
  this->reservedBytes = this->reservedBytes + sVar1 * -0x1000;
  this->numberOfSegments = this->numberOfSegments - 1;
  pPVar2 = this->memoryData;
  if (pPVar2 != (PageMemoryData *)0x0) {
    pPVar2->releaseSegmentCount = pPVar2->releaseSegmentCount + 1;
    pPVar2->releaseSegmentBytes = pPVar2->releaseSegmentBytes + sVar1 * 0x1000;
  }
  return;
}

Assistant:

size_t GetPageCount() const { return segmentPageCount; }